

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registration_manager.cpp
# Opt level: O1

shared_ptr<miniros::master::NodeRef> __thiscall
miniros::master::RegistrationManager::getNodeByAPIUnsafe(RegistrationManager *this,string *api)

{
  _Base_ptr p_Var1;
  undefined4 uVar2;
  int iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Self __tmp;
  _Rb_tree_node_base *p_Var5;
  bool bVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  shared_ptr<miniros::master::NodeRef> sVar9;
  string local_50;
  
  p_Var5 = *(_Rb_tree_node_base **)((long)&api[0xb].field_2 + 8);
  bVar6 = p_Var5 == (_Rb_tree_node_base *)&api[0xb]._M_string_length;
  _Var4._M_pi = in_RDX;
  if (!bVar6) {
    do {
      NodeRef::getApi_abi_cxx11_(&local_50,*(NodeRef **)(p_Var5 + 2));
      _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length ==
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&in_RDX->_M_use_count) {
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          bVar7 = true;
        }
        else {
          iVar3 = bcmp(local_50._M_dataplus._M_p,in_RDX->_vptr__Sp_counted_base,
                       local_50._M_string_length);
          bVar7 = iVar3 == 0;
          _Var4._M_pi = extraout_RDX;
        }
      }
      else {
        bVar7 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        _Var4._M_pi = extraout_RDX_00;
      }
      if (bVar7) {
        uVar2 = *(undefined4 *)&p_Var5[2].field_0x4;
        *(_Rb_tree_color *)&(this->publishers).map._M_t._M_impl.field_0x0 = p_Var5[2]._M_color;
        *(undefined4 *)&(this->publishers).map._M_t._M_impl.field_0x4 = uVar2;
        p_Var1 = p_Var5[2]._M_parent;
        *(_Base_ptr *)&(this->publishers).map._M_t._M_impl.super__Rb_tree_header._M_header = p_Var1;
        if (p_Var1 != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
            UNLOCK();
          }
          else {
            *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
          }
        }
        if (!bVar6) goto LAB_0023c3d2;
        break;
      }
      auVar8 = ::std::_Rb_tree_increment(p_Var5);
      _Var4._M_pi = auVar8._8_8_;
      p_Var5 = auVar8._0_8_;
      bVar6 = p_Var5 == (_Rb_tree_node_base *)&api[0xb]._M_string_length;
    } while (!bVar6);
  }
  *(undefined8 *)&(this->publishers).map._M_t._M_impl = 0;
  *(undefined8 *)&(this->publishers).map._M_t._M_impl.super__Rb_tree_header._M_header = 0;
LAB_0023c3d2:
  sVar9.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar9.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<miniros::master::NodeRef>)
         sVar9.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<NodeRef> RegistrationManager::getNodeByAPIUnsafe(const std::string& api) const
{
  for (auto it = m_nodes.begin(); it != m_nodes.end(); it++) {
    if (it->second->getApi() == api)
      return it->second;
  }
  return {};
}